

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O0

void __thiscall nivalis::Plotter::render(Plotter *this,View *view)

{
  initializer_list<std::array<double,_2UL>_> __l;
  ulong uVar1;
  int *piVar2;
  bool bVar3;
  uint uVar4;
  uint64_t uVar5;
  vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *draw_buf;
  View *render_view;
  size_type sVar6;
  reference pvVar7;
  Expr *pEVar8;
  reference pvVar9;
  color *pcVar10;
  ASTNode *pAVar11;
  reference pvVar12;
  double *pdVar13;
  unsigned_long *puVar14;
  reference pvVar15;
  int *in_RSI;
  size_t in_RDI;
  double dVar16;
  double dVar17;
  Plotter *unaff_retaddr;
  DrawBufferObject obj_2;
  DrawBufferObject obj2_1;
  value_type *right;
  value_type *a_1;
  DrawBufferObject obj_1;
  size_t is_ellipse;
  DrawBufferObject obj2;
  value_type *b;
  value_type *a;
  DrawBufferObject obj;
  color c;
  double thresh_r;
  size_t near_idx;
  double theta;
  double t_2;
  double alpha;
  double r_1;
  double theta_mod;
  double x_3;
  float sx_1;
  double y_3;
  float sy_1;
  double t_end;
  double t_start;
  double end_mod;
  double beg_mod;
  float INTERVAL;
  double y_2;
  double x_2;
  double r;
  double t_1;
  bool is_ineq_less;
  bool is_ineq;
  bool has_line;
  double tmax_1;
  double tmin_1;
  vector<double,_std::allocator<double>_> vals;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> curr_line_1;
  float sy;
  float sx;
  double y_1;
  double x_1;
  double t;
  double py;
  double px;
  double tstep;
  double tmax;
  double tmin;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> curr_line;
  int ftype_nomod_1;
  value_type *func_2;
  size_t funcid_2;
  double y;
  double x;
  value_type *expr_y;
  value_type *expr_x;
  PointMarker ptm;
  size_t i_1;
  double mark_radius;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> line;
  value_type *func_1;
  size_t funcid_1;
  uint64_t var;
  size_t i;
  bool has_call;
  int ftype_nomod;
  value_type *func;
  size_t funcid;
  bool prev_loss_detail;
  double PARAMETRIC_DISCONN_THRESH;
  uint in_stack_fffffffffffff638;
  int in_stack_fffffffffffff63c;
  uint in_stack_fffffffffffff640;
  undefined4 in_stack_fffffffffffff644;
  color *in_stack_fffffffffffff648;
  DrawBufferObject *in_stack_fffffffffffff650;
  DrawBufferObject *in_stack_fffffffffffff658;
  DrawBufferObject *in_stack_fffffffffffff660;
  DrawBufferObject *pDVar18;
  pointer in_stack_fffffffffffff668;
  allocator<char> *in_stack_fffffffffffff670;
  Environment *in_stack_fffffffffffff678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff680;
  size_type in_stack_fffffffffffff6a8;
  string *in_stack_fffffffffffff6b0;
  Environment *in_stack_fffffffffffff6b8;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
  *in_stack_fffffffffffff6c0;
  View *in_stack_fffffffffffff6c8;
  vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
  *in_stack_fffffffffffff6d0;
  double local_8e8;
  undefined7 in_stack_fffffffffffff7c8;
  undefined1 in_stack_fffffffffffff7cf;
  ulong in_stack_fffffffffffff7d0;
  Environment *in_stack_fffffffffffff7d8;
  color *c_00;
  undefined4 in_stack_fffffffffffff7e0;
  uint in_stack_fffffffffffff7e4;
  Expr *in_stack_fffffffffffff7e8;
  ulong uVar19;
  array<double,_2UL> local_7b8;
  array<double,_2UL> *local_7a8;
  undefined8 local_7a0;
  undefined1 in_stack_fffffffffffff8b9;
  undefined1 in_stack_fffffffffffff8ba;
  undefined1 in_stack_fffffffffffff8bb;
  undefined4 in_stack_fffffffffffff8bc;
  size_t in_stack_fffffffffffff8c0;
  color *in_stack_fffffffffffff8c8;
  Plotter *in_stack_fffffffffffff8d0;
  View *in_stack_fffffffffffff8d8;
  vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
  *in_stack_fffffffffffff8e0;
  string local_710 [32];
  undefined4 local_6f0;
  int local_610;
  reference local_608;
  reference local_600;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> local_5c8;
  undefined4 local_5b0;
  size_type local_578;
  int local_550;
  ulong local_548;
  undefined4 local_468;
  reference local_460;
  reference local_458;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> local_420;
  undefined4 local_408;
  size_type local_3d0;
  undefined4 local_3a8;
  float *local_378;
  double local_370;
  unsigned_long local_368;
  double local_360;
  double local_358;
  ulong local_350;
  size_type local_348;
  double local_340;
  double local_338;
  double local_330;
  double local_328;
  double local_320;
  double local_318;
  float local_30c;
  double local_308;
  float local_2fc;
  double local_2f8;
  double local_2f0;
  double local_2e8;
  double local_2e0;
  undefined4 local_2d4;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  byte local_29b;
  byte local_29a;
  byte local_299;
  double local_298;
  double local_290;
  vector<double,_std::allocator<double>_> local_288 [2];
  float local_258;
  float local_254;
  float local_250;
  float local_24c;
  double local_248;
  double local_240;
  double local_238;
  double local_230;
  double local_228;
  double local_220;
  double local_218;
  double local_210;
  double local_208;
  double local_200 [4];
  uint local_1dc;
  reference local_1d8;
  ulong local_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  reference local_1a8;
  reference local_1a0;
  double local_198;
  double local_190;
  undefined4 local_188;
  color *local_180;
  size_type local_178;
  size_type local_170;
  undefined1 local_168;
  ulong local_160;
  undefined8 local_158;
  reference local_138;
  color *local_130;
  ASTNode local_110 [4];
  ulong local_d0;
  Expr *local_c8;
  byte local_bd;
  uint local_bc;
  reference local_b8;
  ulong local_b0;
  byte local_a1;
  double local_a0;
  allocator<char> local_91;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [39];
  bool reverse_xy;
  size_t funcid_00;
  
  unique0x10002083 = in_RSI;
  funcid_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff680,(char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670);
  uVar5 = Environment::addr_of
                    (in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,
                     SUB81(in_stack_fffffffffffff6a8 >> 0x38,0));
  *(int *)(in_RDI + 0x310) = (int)uVar5;
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff680,(char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670);
  uVar5 = Environment::addr_of
                    (in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,
                     SUB81(in_stack_fffffffffffff6a8 >> 0x38,0));
  *(int *)(in_RDI + 0x314) = (int)uVar5;
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  draw_buf = (vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *)
             (in_RDI + 0x140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff680,(char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670);
  render_view = (View *)Environment::addr_of
                                  (in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,
                                   SUB81(in_stack_fffffffffffff6a8 >> 0x38,0));
  *(int *)(in_RDI + 0x318) = (int)render_view;
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  dVar16 = util::sqr_dist<double>
                     (*(double *)(stack0xfffffffffffffff0 + 4),
                      *(double *)(stack0xfffffffffffffff0 + 8),
                      *(double *)(stack0xfffffffffffffff0 + 2),
                      *(double *)(stack0xfffffffffffffff0 + 6));
  local_a0 = sqrt(dVar16);
  local_a0 = local_a0 * 0.01;
  local_a1 = *(byte *)(in_RDI + 0x2b0) & 1;
  *(undefined1 *)(in_RDI + 0x2b0) = 0;
  std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::clear
            ((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)0x17e24d);
  std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::reserve
            ((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
             in_stack_fffffffffffff670,(size_type)in_stack_fffffffffffff668);
  std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::clear
            ((vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *)
             0x17e27a);
  local_b0 = 0;
  do {
    uVar19 = local_b0;
    sVar6 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
                      ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                       (in_RDI + 0x40));
    if (sVar6 <= uVar19) {
      local_130 = (color *)0x0;
      while (c_00 = local_130,
            pcVar10 = (color *)std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::
                               size((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *
                                    )(in_RDI + 0x40)), c_00 < pcVar10) {
        local_138 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
                              ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                               (in_RDI + 0x40),(size_type)local_130);
        if ((((local_138->type & 0xfffffff8U) == 0x80) &&
            (sVar6 = std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::size
                               (&local_138->exprs), sVar6 != 0)) &&
           (sVar6 = std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::size
                              (&local_138->exprs), (sVar6 & 1) == 0)) {
          std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::vector
                    ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     0x17e78b);
          local_158 = 0x4000000000000000;
          local_160 = 0;
          while (in_stack_fffffffffffff7d0 = local_160,
                sVar6 = std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::size
                                  (&local_138->exprs), in_stack_fffffffffffff7d0 < sVar6) {
            local_1a0 = std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::operator[]
                                  (&local_138->exprs,local_160);
            local_1a8 = std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::operator[]
                                  (&local_138->exprs,local_160 + 1);
            local_170 = 0xffffffffffffffff;
            local_178 = 0xffffffffffffffff;
            in_stack_fffffffffffff7cf =
                 Expr::is_ref((Expr *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640))
            ;
            if ((bool)in_stack_fffffffffffff7cf) {
              pAVar11 = Expr::operator[]((Expr *)CONCAT44(in_stack_fffffffffffff644,
                                                          in_stack_fffffffffffff640),
                                         in_stack_fffffffffffff63c);
              local_178 = (pAVar11->field_1).ref;
              pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                                   local_178);
              uVar4 = std::isnan(*pvVar12);
              if ((uVar4 & 1) != 0) {
                pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                                     local_178);
                *pvVar12 = 1.0;
              }
            }
            bVar3 = Expr::is_ref((Expr *)CONCAT44(in_stack_fffffffffffff644,
                                                  in_stack_fffffffffffff640));
            if (bVar3) {
              pAVar11 = Expr::operator[]((Expr *)CONCAT44(in_stack_fffffffffffff644,
                                                          in_stack_fffffffffffff640),
                                         in_stack_fffffffffffff63c);
              local_170 = (pAVar11->field_1).ref;
              pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                                   local_170);
              uVar4 = std::isnan(*pvVar12);
              if ((uVar4 & 1) != 0) {
                pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                                     local_170);
                *pvVar12 = 1.0;
              }
            }
            local_1b0 = Expr::operator()((Expr *)in_stack_fffffffffffff680,in_stack_fffffffffffff678
                                        );
            local_1b8 = Expr::operator()((Expr *)in_stack_fffffffffffff680,in_stack_fffffffffffff678
                                        );
            uVar4 = std::isnan(local_1b0);
            if ((((uVar4 & 1) == 0) && (uVar4 = std::isnan(local_1b8), (uVar4 & 1) == 0)) &&
               ((uVar4 = std::isinf(local_1b0), (uVar4 & 1) == 0 &&
                (uVar4 = std::isinf(local_1b8), (uVar4 & 1) == 0)))) {
              local_1c8 = local_1b0;
              local_1c0 = local_1b8;
              std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
              push_back((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                        (value_type *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638))
              ;
              local_188 = 0;
              local_190 = local_1b8;
              local_198 = local_1b0;
              local_168 = 0;
              local_180 = local_130;
              std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::push_back
                        ((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
                         CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                         (value_type *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638)
                        );
            }
            local_160 = local_160 + 2;
          }
          in_stack_fffffffffffff640 = (local_138->type & 2U) >> 1;
          in_stack_fffffffffffff638 = (uint)((local_138->type & 4U) == 0);
          anon_unknown_1::buf_add_polyline
                    (in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,
                     (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,
                     (float)in_stack_fffffffffffff8bc,(bool)in_stack_fffffffffffff8bb,
                     (bool)in_stack_fffffffffffff8ba,(bool)in_stack_fffffffffffff8b9);
          std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::~vector
                    (&in_stack_fffffffffffff650->points);
        }
        local_130 = (color *)((long)local_130->data + 1);
      }
      for (local_1d0 = 0; uVar1 = local_1d0,
          sVar6 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
                            ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                             (in_RDI + 0x40)), uVar1 < sVar6; local_1d0 = local_1d0 + 1) {
        local_1d8 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
                              ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                               (in_RDI + 0x40),local_1d0);
        piVar2 = stack0xfffffffffffffff0;
        local_1dc = local_1d8->type & 0xfffffff8;
        reverse_xy = SUB81((ulong)stack0xfffffffffffffff0 >> 0x38,0);
        if (local_1dc == 0) {
          plot_explicit(unaff_retaddr,funcid_00,reverse_xy);
          stack0xfffffffffffffff0 = piVar2;
        }
        else if (local_1dc == 8) {
          plot_explicit(unaff_retaddr,funcid_00,reverse_xy);
          stack0xfffffffffffffff0 = piVar2;
        }
        else {
          unique0x1000214b = piVar2;
          if (local_1dc == 0x10) {
            plot_implicit(in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8);
          }
          else if (local_1dc == 0x18) {
            std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::vector
                      ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *
                       )0x17f1e7);
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)0x17f1f4);
            local_290 = (double)local_1d8->tmin;
            local_298 = (double)local_1d8->tmax;
            if (local_298 < local_290) {
              std::swap<double>(&local_290,&local_298);
            }
            local_299 = (local_1d8->type & 2U) == 0;
            local_29a = (local_1d8->type & 1U) != 0;
            local_29b = (local_1d8->type & 4U) != 0;
            if ((bool)local_29a) {
              std::vector<double,_std::allocator<double>_>::reserve
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff670,
                         (size_type)in_stack_fffffffffffff668);
            }
            if ((local_299 & 1) != 0) {
              std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
              reserve((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                      in_stack_fffffffffffff670,(size_type)in_stack_fffffffffffff668);
            }
            for (local_2a8 = local_290; dVar16 = local_2a8, local_2a8 <= local_298;
                local_2a8 = local_2a8 + 0.0031415926535897933) {
              pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                                   (ulong)*(uint *)(in_RDI + 0x318));
              *pvVar12 = dVar16;
              local_2b0 = Expr::operator()((Expr *)in_stack_fffffffffffff680,
                                           in_stack_fffffffffffff678);
              if ((local_29a & 1) != 0) {
                std::vector<double,_std::allocator<double>_>::push_back
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff650,
                           (value_type_conflict2 *)in_stack_fffffffffffff648);
              }
              dVar16 = local_2b0;
              if ((local_299 & 1) != 0) {
                local_2b8 = cos(local_2a8);
                dVar17 = local_2b0;
                local_2b8 = dVar16 * local_2b8;
                local_2c8 = sin(local_2a8);
                local_2c8 = dVar17 * local_2c8;
                local_2d0 = local_2b8;
                local_2c0 = local_2c8;
                std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
                push_back((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                          (value_type *)
                          CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
              }
            }
            if ((local_299 & 1) != 0) {
              in_stack_fffffffffffff640 = 0;
              in_stack_fffffffffffff638 = 1;
              anon_unknown_1::buf_add_polyline
                        (in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,
                         (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                          *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                         in_stack_fffffffffffff8c0,(float)in_stack_fffffffffffff8bc,
                         (bool)in_stack_fffffffffffff8bb,(bool)in_stack_fffffffffffff8ba,
                         (bool)in_stack_fffffffffffff8b9);
            }
            if ((local_29a & 1) != 0) {
              local_2d4 = 0x3fc00000;
              local_2e0 = fmod(local_290,6.283185307179586);
              local_2e8 = fmod(local_298,6.283185307179586);
              if (local_2e0 < 0.0) {
                local_2e0 = local_2e0 + 6.283185307179586;
              }
              if (local_2e8 < 0.0) {
                local_2e8 = local_2e8 + 6.283185307179586;
              }
              local_2f0 = local_290 - local_2e0;
              if ((local_2e8 != 0.0) || (NAN(local_2e8))) {
                local_8e8 = 6.283185307179586 - local_2e8;
              }
              else {
                local_8e8 = 0.0;
              }
              local_2f8 = local_298 + local_8e8;
              for (local_2fc = 0.0; local_2fc < (float)stack0xfffffffffffffff0[1];
                  local_2fc = local_2fc + 1.5) {
                local_308 = ((double)((float)stack0xfffffffffffffff0[1] - local_2fc) * 1.0 *
                            (*(double *)(stack0xfffffffffffffff0 + 6) -
                            *(double *)(stack0xfffffffffffffff0 + 8))) /
                            (double)stack0xfffffffffffffff0[1] +
                            *(double *)(stack0xfffffffffffffff0 + 8);
                for (local_30c = 0.0; local_30c < (float)*stack0xfffffffffffffff0;
                    local_30c = local_30c + 1.5) {
                  local_318 = ((double)local_30c * 1.0 *
                              (*(double *)(stack0xfffffffffffffff0 + 2) -
                              *(double *)(stack0xfffffffffffffff0 + 4))) /
                              (double)*stack0xfffffffffffffff0 +
                              *(double *)(stack0xfffffffffffffff0 + 4);
                  local_320 = atan2(local_308,local_318);
                  local_328 = sqrt(local_318 * local_318 + local_308 * local_308);
                  if (local_320 < 0.0) {
                    local_320 = local_320 + 6.283185307179586;
                  }
                  local_330 = 0.0;
                  for (local_338 = local_2f0; local_338 <= local_298 + local_2f8;
                      local_338 = local_338 + 6.283185307179586) {
                    local_340 = local_338 + local_320;
                    if ((local_290 <= local_340) && (local_340 <= local_298)) {
                      local_358 = round((local_340 - local_290) / 0.0031415926535897933);
                      local_360 = 0.0;
                      pdVar13 = std::max<double>(&local_358,&local_360);
                      local_350 = (ulong)*pdVar13;
                      local_350 = local_350 |
                                  (long)(*pdVar13 - 9.223372036854776e+18) & (long)local_350 >> 0x3f
                      ;
                      sVar6 = std::vector<double,_std::allocator<double>_>::size(local_288);
                      local_368 = sVar6 - 1;
                      puVar14 = std::min<unsigned_long>(&local_350,&local_368);
                      local_348 = *puVar14;
                      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                          (local_288,local_348);
                      local_370 = *pvVar12;
                      if (local_328 < local_370 == (bool)(local_29b & 1)) {
                        local_330 = local_330 * 0.75 + 0.25;
                      }
                    }
                  }
                  if (0.0 < local_330) {
                    color::color::color((color *)CONCAT44(in_stack_fffffffffffff644,
                                                          in_stack_fffffffffffff640),
                                        (color *)CONCAT44(in_stack_fffffffffffff63c,
                                                          in_stack_fffffffffffff638));
                    *local_378 = (float)local_330;
                    anon_unknown_1::buf_add_screen_rectangle
                              (draw_buf,render_view,(float)(uVar19 >> 0x20),(float)uVar19,
                               (float)((ulong)in_stack_fffffffffffff7e8 >> 0x20),
                               SUB84(in_stack_fffffffffffff7e8,0),
                               SUB41(in_stack_fffffffffffff7e4 >> 0x18,0),c_00,
                               (float)(in_stack_fffffffffffff7d0 >> 0x20),
                               CONCAT17(in_stack_fffffffffffff7cf,in_stack_fffffffffffff7c8));
                  }
                }
              }
            }
            std::vector<double,_std::allocator<double>_>::~vector
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff650);
            std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::~vector
                      (&in_stack_fffffffffffff650->points);
          }
          else if (local_1dc == 0x28) {
            sVar6 = std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::size
                              (&local_1d8->exprs);
            if (sVar6 == 2) {
              std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::vector
                        ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *
                         )0x17edb6);
              local_200[0] = (double)local_1d8->tmin;
              local_208 = (double)local_1d8->tmax;
              if (local_208 < local_200[0]) {
                std::swap<double>(local_200,&local_208);
              }
              local_218 = (local_208 - local_200[0]) / 10000.0;
              local_220 = 1e-12;
              pdVar13 = std::max<double>(&local_218,&local_220);
              local_210 = *pdVar13;
              for (local_238 = local_200[0]; dVar16 = local_238, local_238 <= local_208;
                  local_238 = local_210 + local_238) {
                pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                                     (ulong)*(uint *)(in_RDI + 0x318));
                *pvVar12 = dVar16;
                std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::operator[]
                          (&local_1d8->exprs,0);
                local_240 = Expr::operator()((Expr *)in_stack_fffffffffffff680,
                                             in_stack_fffffffffffff678);
                std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::operator[]
                          (&local_1d8->exprs,1);
                local_248 = Expr::operator()((Expr *)in_stack_fffffffffffff680,
                                             in_stack_fffffffffffff678);
                if ((local_200[0] < local_238) &&
                   (dVar16 = util::sqr_dist<double>(local_240,local_248,local_228,local_230),
                   local_a0 < dVar16)) {
                  in_stack_fffffffffffff640 = 0;
                  in_stack_fffffffffffff638 = 1;
                  anon_unknown_1::buf_add_screen_polyline
                            (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,
                             in_stack_fffffffffffff6c0,(color *)in_stack_fffffffffffff6b8,
                             (size_t)in_stack_fffffffffffff6b0,
                             (float)(in_stack_fffffffffffff6a8 >> 0x20),
                             SUB81(in_stack_fffffffffffff6a8 >> 0x18,0),
                             SUB81(in_stack_fffffffffffff6a8 >> 0x10,0),
                             SUB81(in_stack_fffffffffffff6a8 >> 8,0));
                  std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
                  clear((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                        0x17f050);
                }
                local_258 = (float)(((local_240 - *(double *)(stack0xfffffffffffffff0 + 4)) *
                                    (double)*stack0xfffffffffffffff0) /
                                   (*(double *)(stack0xfffffffffffffff0 + 2) -
                                   *(double *)(stack0xfffffffffffffff0 + 4)));
                local_254 = (float)(((*(double *)(stack0xfffffffffffffff0 + 6) - local_248) *
                                    (double)stack0xfffffffffffffff0[1]) /
                                   (*(double *)(stack0xfffffffffffffff0 + 6) -
                                   *(double *)(stack0xfffffffffffffff0 + 8)));
                local_250 = local_254;
                local_24c = local_258;
                std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
                push_back((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                          (value_type *)
                          CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
                local_228 = local_240;
                local_230 = local_248;
              }
              in_stack_fffffffffffff640 = 0;
              in_stack_fffffffffffff638 = 1;
              anon_unknown_1::buf_add_screen_polyline
                        (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,
                         in_stack_fffffffffffff6c0,(color *)in_stack_fffffffffffff6b8,
                         (size_t)in_stack_fffffffffffff6b0,
                         (float)(in_stack_fffffffffffff6a8 >> 0x20),
                         SUB81(in_stack_fffffffffffff6a8 >> 0x18,0),
                         SUB81(in_stack_fffffffffffff6a8 >> 0x10,0),
                         SUB81(in_stack_fffffffffffff6a8 >> 8,0));
              std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::~vector
                        ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *
                         )in_stack_fffffffffffff650);
            }
          }
          else if (local_1dc == 0x88) {
            sVar6 = std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::size
                              (&local_1d8->exprs);
            if (sVar6 == 4) {
              DrawBufferObject::DrawBufferObject(in_stack_fffffffffffff650);
              local_3d0 = local_1d0;
              color::color::operator=
                        (in_stack_fffffffffffff648,
                         (color *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
              local_408 = 0x40000000;
              local_3a8 = 3;
              std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
              resize(&in_stack_fffffffffffff660->points,(size_type)in_stack_fffffffffffff658);
              local_458 = std::
                          vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                          ::operator[](&local_420,0);
              local_460 = std::
                          vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                          ::operator[](&local_420,1);
              std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::operator[]
                        (&local_1d8->exprs,0);
              dVar16 = Expr::operator()((Expr *)in_stack_fffffffffffff680,in_stack_fffffffffffff678)
              ;
              pvVar15 = std::array<double,_2UL>::operator[]
                                  ((array<double,_2UL> *)
                                   CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                                   CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
              *pvVar15 = dVar16;
              std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::operator[]
                        (&local_1d8->exprs,1);
              dVar16 = Expr::operator()((Expr *)in_stack_fffffffffffff680,in_stack_fffffffffffff678)
              ;
              pvVar15 = std::array<double,_2UL>::operator[]
                                  ((array<double,_2UL> *)
                                   CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                                   CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
              *pvVar15 = dVar16;
              std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::operator[]
                        (&local_1d8->exprs,2);
              dVar16 = Expr::operator()((Expr *)in_stack_fffffffffffff680,in_stack_fffffffffffff678)
              ;
              pvVar15 = std::array<double,_2UL>::operator[]
                                  ((array<double,_2UL> *)
                                   CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                                   CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
              *pvVar15 = dVar16;
              std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::operator[]
                        (&local_1d8->exprs,3);
              dVar16 = Expr::operator()((Expr *)in_stack_fffffffffffff680,in_stack_fffffffffffff678)
              ;
              pvVar15 = std::array<double,_2UL>::operator[]
                                  ((array<double,_2UL> *)
                                   CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                                   CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
              *pvVar15 = dVar16;
              pvVar15 = std::array<double,_2UL>::operator[]
                                  ((array<double,_2UL> *)
                                   CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                                   CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
              in_stack_fffffffffffff6d0 =
                   (vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *)
                   *pvVar15;
              pvVar15 = std::array<double,_2UL>::operator[]
                                  ((array<double,_2UL> *)
                                   CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                                   CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
              if ((double)in_stack_fffffffffffff6d0 < *pvVar15) {
                in_stack_fffffffffffff6c8 =
                     (View *)std::array<double,_2UL>::operator[]
                                       ((array<double,_2UL> *)
                                        CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640
                                                ),
                                        CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638
                                                ));
                pvVar15 = std::array<double,_2UL>::operator[]
                                    ((array<double,_2UL> *)
                                     CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                                     CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
                std::swap<double>((double *)in_stack_fffffffffffff6c8,pvVar15);
              }
              pvVar15 = std::array<double,_2UL>::operator[]
                                  ((array<double,_2UL> *)
                                   CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                                   CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
              in_stack_fffffffffffff6c0 =
                   (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                   *pvVar15;
              pvVar15 = std::array<double,_2UL>::operator[]
                                  ((array<double,_2UL> *)
                                   CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                                   CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
              if ((double)in_stack_fffffffffffff6c0 < *pvVar15) {
                in_stack_fffffffffffff6b8 =
                     (Environment *)
                     std::array<double,_2UL>::operator[]
                               ((array<double,_2UL> *)
                                CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                                CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
                pvVar15 = std::array<double,_2UL>::operator[]
                                    ((array<double,_2UL> *)
                                     CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                                     CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
                std::swap<double>((double *)in_stack_fffffffffffff6b8,pvVar15);
              }
              if ((local_1d8->type & 2U) != 0) {
                DrawBufferObject::DrawBufferObject
                          (in_stack_fffffffffffff660,in_stack_fffffffffffff658);
                local_468 = 4;
                anon_unknown_1::get_ineq_color(in_stack_fffffffffffff648);
                color::color::operator=
                          (in_stack_fffffffffffff648,
                           (color *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
                std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
                push_back((vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                           *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                          (value_type *)
                          CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
                DrawBufferObject::~DrawBufferObject
                          ((DrawBufferObject *)
                           CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
              }
              if ((local_1d8->type & 4U) == 0) {
                std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
                push_back((vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                           *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                          (value_type *)
                          CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
              }
              DrawBufferObject::~DrawBufferObject
                        ((DrawBufferObject *)
                         CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
            }
          }
          else if ((local_1dc == 0x90) || (local_1dc == 0x98)) {
            local_548 = (ulong)(local_1dc == 0x98);
            sVar6 = std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::size
                              (&local_1d8->exprs);
            if (sVar6 == local_548 + 3) {
              DrawBufferObject::DrawBufferObject(in_stack_fffffffffffff650);
              local_578 = local_1d0;
              color::color::operator=
                        (in_stack_fffffffffffff648,
                         (color *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
              local_5b0 = 0x40000000;
              local_550 = (local_548 != 0) + 7 + (uint)(local_548 != 0);
              std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
              resize(&in_stack_fffffffffffff660->points,(size_type)in_stack_fffffffffffff658);
              in_stack_fffffffffffff6a8 = 0;
              local_600 = std::
                          vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                          ::operator[](&local_5c8,0);
              local_608 = std::
                          vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                          ::operator[](&local_5c8,1);
              std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::operator[]
                        (&local_1d8->exprs,in_stack_fffffffffffff6a8);
              in_stack_fffffffffffff6b0 =
                   (string *)
                   Expr::operator()((Expr *)in_stack_fffffffffffff680,in_stack_fffffffffffff678);
              pvVar15 = std::array<double,_2UL>::operator[]
                                  ((array<double,_2UL> *)
                                   CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                                   CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
              *pvVar15 = (value_type_conflict2)in_stack_fffffffffffff6b0;
              std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::operator[]
                        (&local_1d8->exprs,1);
              dVar16 = Expr::operator()((Expr *)in_stack_fffffffffffff680,in_stack_fffffffffffff678)
              ;
              pvVar15 = std::array<double,_2UL>::operator[]
                                  ((array<double,_2UL> *)
                                   CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                                   CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
              *pvVar15 = dVar16;
              pvVar15 = std::array<double,_2UL>::operator[]
                                  ((array<double,_2UL> *)
                                   CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                                   CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
              dVar16 = *pvVar15;
              std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::operator[]
                        (&local_1d8->exprs,2);
              dVar17 = Expr::operator()((Expr *)in_stack_fffffffffffff680,in_stack_fffffffffffff678)
              ;
              in_stack_fffffffffffff678 = (Environment *)(dVar16 + dVar17);
              pvVar15 = std::array<double,_2UL>::operator[]
                                  ((array<double,_2UL> *)
                                   CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                                   CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
              *pvVar15 = (value_type_conflict2)in_stack_fffffffffffff678;
              pvVar15 = std::array<double,_2UL>::operator[]
                                  ((array<double,_2UL> *)
                                   CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                                   CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
              in_stack_fffffffffffff680 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*pvVar15;
              pvVar15 = std::array<double,_2UL>::operator[]
                                  ((array<double,_2UL> *)
                                   CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                                   CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
              *pvVar15 = (value_type_conflict2)in_stack_fffffffffffff680;
              if (local_548 != 0) {
                std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::operator[]
                          (&local_1d8->exprs,3);
                in_stack_fffffffffffff670 =
                     (allocator<char> *)
                     Expr::operator()((Expr *)in_stack_fffffffffffff680,in_stack_fffffffffffff678);
                pvVar15 = std::array<double,_2UL>::operator[]
                                    ((array<double,_2UL> *)
                                     CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                                     CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
                *pvVar15 = (double)in_stack_fffffffffffff670 + *pvVar15;
              }
              if ((local_1d8->type & 2U) != 0) {
                DrawBufferObject::DrawBufferObject
                          (in_stack_fffffffffffff660,in_stack_fffffffffffff658);
                local_610 = (local_548 != 0) + 8 + (uint)(local_548 != 0);
                anon_unknown_1::get_ineq_color(in_stack_fffffffffffff648);
                color::color::operator=
                          (in_stack_fffffffffffff648,
                           (color *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
                std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
                push_back((vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                           *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                          (value_type *)
                          CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
                DrawBufferObject::~DrawBufferObject
                          ((DrawBufferObject *)
                           CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
              }
              if ((local_1d8->type & 4U) == 0) {
                std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
                push_back((vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                           *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                          (value_type *)
                          CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
              }
              DrawBufferObject::~DrawBufferObject
                        ((DrawBufferObject *)
                         CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
            }
          }
          else if ((local_1dc == 0xa0) &&
                  (sVar6 = std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::size
                                     (&local_1d8->exprs), sVar6 == 2)) {
            DrawBufferObject::DrawBufferObject(in_stack_fffffffffffff650);
            color::color::operator=
                      (in_stack_fffffffffffff648,
                       (color *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
            local_6f0 = 0xb;
            pDVar18 = (DrawBufferObject *)&local_7b8;
            std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::operator[]
                      (&local_1d8->exprs,0);
            in_stack_fffffffffffff668 =
                 (pointer)Expr::operator()((Expr *)in_stack_fffffffffffff680,
                                           in_stack_fffffffffffff678);
            in_stack_fffffffffffff660 = pDVar18;
            (pDVar18->points).
            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start = in_stack_fffffffffffff668;
            in_stack_fffffffffffff650 =
                 (DrawBufferObject *)
                 &(pDVar18->points).
                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
            std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::operator[]
                      (&local_1d8->exprs,1);
            in_stack_fffffffffffff658 =
                 (DrawBufferObject *)
                 Expr::operator()((Expr *)in_stack_fffffffffffff680,in_stack_fffffffffffff678);
            (((AST *)&in_stack_fffffffffffff650->points)->
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
            _M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff658;
            local_7a8 = &local_7b8;
            local_7a0._0_4_ = 1.4013e-45;
            local_7a0._4_4_ = 0;
            __l._M_len = (size_type)in_stack_fffffffffffff660;
            __l._M_array = (iterator)in_stack_fffffffffffff658;
            std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
            operator=(&in_stack_fffffffffffff650->points,__l);
            std::__cxx11::string::operator=(local_710,(string *)&local_1d8->str);
            std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
            push_back((vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                       *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                      (value_type *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
            DrawBufferObject::~DrawBufferObject
                      ((DrawBufferObject *)
                       CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
          }
        }
      }
      if ((*(byte *)(in_RDI + 0x2b0) & 1) == 0) {
        if ((local_a1 & 1) != 0) {
          std::__cxx11::string::clear();
        }
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)(in_RDI + 0x58),"Warning: some detail may be lost");
      }
      return;
    }
    local_b8 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
                         ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                          (in_RDI + 0x40),local_b0);
    local_bc = local_b8->type & 0xfffffff8;
    if ((local_bc == 0) || (local_bc == 8)) {
      local_bd = 0;
      local_c8 = (Expr *)0x0;
      while( true ) {
        in_stack_fffffffffffff7e8 = local_c8;
        pvVar7 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
                           ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                            (in_RDI + 0x40),local_b0);
        pEVar8 = (Expr *)std::
                         vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                         size(&(pvVar7->expr).ast);
        if (pEVar8 <= in_stack_fffffffffffff7e8) break;
        pvVar7 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
                           ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                            (in_RDI + 0x40),local_b0);
        pvVar9 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                 operator[](&(pvVar7->expr).ast,(size_type)local_c8);
        if (pvVar9->opcode == 0xc) {
          local_bd = 1;
          break;
        }
        local_c8 = (Expr *)((long)&(local_c8->ast).
                                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1);
      }
      if ((((local_bd & 1) != 0) &&
          (sVar6 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
                             ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                              (in_RDI + 0x40)), sVar6 <= *(ulong *)(in_RDI + 0x138))) &&
         ((local_bc == 0 || (local_bc == 8)))) {
        if (local_bc == 8) {
          in_stack_fffffffffffff7e4 = *(uint *)(in_RDI + 0x314);
        }
        else {
          in_stack_fffffffffffff7e4 = *(uint *)(in_RDI + 0x310);
        }
        local_d0 = (ulong)in_stack_fffffffffffff7e4;
        Expr::diff(in_stack_fffffffffffff7e8,
                   CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                   in_stack_fffffffffffff7d8);
        Expr::operator=((Expr *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                        (Expr *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
        Expr::~Expr((Expr *)0x17e594);
        bVar3 = Expr::is_null((Expr *)in_stack_fffffffffffff650);
        if (bVar3) {
          Expr::ASTNode::ASTNode(local_110,null);
          pvVar9 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                   operator[](&(local_b8->ddiff).ast,0);
          pvVar9->opcode = local_110[0].opcode;
          *(undefined4 *)&pvVar9->field_0x4 = local_110[0]._4_4_;
          pvVar9->field_1 = local_110[0].field_1;
        }
        else {
          Expr::diff(in_stack_fffffffffffff7e8,
                     CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                     in_stack_fffffffffffff7d8);
          Expr::operator=((Expr *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                          (Expr *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
          Expr::~Expr((Expr *)0x17e608);
        }
        Expr::diff(in_stack_fffffffffffff7e8,
                   CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                   in_stack_fffffffffffff7d8);
        Expr::operator=((Expr *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                        (Expr *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
        Expr::~Expr((Expr *)0x17e6a4);
      }
    }
    local_b0 = local_b0 + 1;
  } while( true );
}

Assistant:

void Plotter::render(const View& view) {
    // Re-register some special vars, just in case they got deleted
    x_var = env.addr_of("x", false);
    y_var = env.addr_of("y", false);
    t_var = env.addr_of("t", false);

    // * Constants
    // Number of different t values to evaluate for a parametric equation
    static const double PARAMETRIC_STEPS = 1e4;
    // Number of different t values to evaluate for a polar function
    static const double POLAR_STEP_SIZE = M_PI * 1e-3;
    // If parametric function moves more than this amount (square of l2),
    // disconnects the function line
    const double PARAMETRIC_DISCONN_THRESH = 1e-2 *
        std::sqrt(util::sqr_dist(view.xmin, view.ymin, view.xmax, view.ymax));

    bool prev_loss_detail = loss_detail;
    loss_detail = false; // Will set to show 'some detail may be lost'

    // * Clear back buffers
    pt_markers.clear(); pt_markers.reserve(500);
    draw_buf.clear();

    for (size_t funcid = 0; funcid < funcs.size(); ++funcid) {
        auto& func = funcs[funcid];
        auto ftype_nomod = func.type & ~Function::FUNC_TYPE_MOD_ALL;
        if (ftype_nomod == Function::FUNC_TYPE_EXPLICIT ||
                ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y) {
            bool has_call = false;
            for (size_t i = 0 ; i < funcs[funcid].expr.ast.size(); ++i) {
                if (funcs[funcid].expr.ast[i].opcode == OpCode::call) {
                    has_call = true;
                    break;
                }
            }
            if (has_call && funcs.size() <= max_functions_find_crit_points) {
                // Re-compute derivatives, if explicit and has
                // at least one user-function call
                // This is needed since the user function may have been changed
                if (ftype_nomod == Function::FUNC_TYPE_EXPLICIT ||
                        ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y) {
                    uint64_t var = ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y ?  y_var : x_var;
                    func.diff = func.expr.diff(var, env);
                    if (!func.diff.is_null()) {
                        func.ddiff = func.diff.diff(var, env);
                    }
                    else func.ddiff.ast[0] = OpCode::null;
                    func.drecip = func.recip.diff(var, env);
                }
            }
        }
    }

    // * Draw functions
    // BEGIN_PROFILE;
    for (size_t funcid = 0; funcid < funcs.size(); ++funcid) {
        auto& func = funcs[funcid];
        if ((func.type & ~Function::FUNC_TYPE_MOD_ALL) ==
                Function::FUNC_TYPE_GEOM_POLYLINE) {
            // Draw polyline
            // Do this first since it can affect other functions in the same frame
            // e.g (p, q) moved
            if (func.exprs.size() && (func.exprs.size() & 1) == 0) {
                std::vector<std::array<double, 2> > line;
                double mark_radius = MARKER_DISP_RADIUS - 1;
                for (size_t i = 0; i < func.exprs.size(); i += 2) {
                    PointMarker ptm;
                    auto& expr_x = func.exprs[i],
                    & expr_y = func.exprs[i+1];
                    ptm.drag_var_x = ptm.drag_var_y = -1;
                    if (expr_x.is_ref()) {
                        ptm.drag_var_x = expr_x[0].ref;
                        if (std::isnan(env.vars[ptm.drag_var_x])) {
                            env.vars[ptm.drag_var_x] = 1.;
                        }
                    }
                    if (expr_y.is_ref()) {
                        ptm.drag_var_y = expr_y[0].ref;
                        if (std::isnan(env.vars[ptm.drag_var_y])) {
                            env.vars[ptm.drag_var_y] = 1.;
                        }
                    }
                    double x = expr_x(env), y = expr_y(env);
                    if (std::isnan(x) || std::isnan(y) ||
                            std::isinf(x) || std::isinf(y)) {
                        continue;
                    }
                    line.push_back({x, y});
                    ptm.label = PointMarker::LABEL_NONE;
                    ptm.y = y; ptm.x = x;
                    ptm.passive = false;
                    ptm.rel_func = funcid;
                    pt_markers.push_back(std::move(ptm));
                }
                buf_add_polyline(draw_buf, view, line, func.line_color,
                        funcid, 2.f,
                        func.type & Function::FUNC_TYPE_MOD_CLOSED,
                        (func.type & Function::FUNC_TYPE_MOD_NOLINE) == 0,
                        func.type & Function::FUNC_TYPE_MOD_FILLED);
            }
        }
    }
    // Draw all other functions
    for (size_t funcid = 0; funcid < funcs.size(); ++funcid) {
        auto& func = funcs[funcid];
        auto ftype_nomod = func.type & ~Function::FUNC_TYPE_MOD_ALL;
        switch (ftype_nomod) {
            case Function::FUNC_TYPE_IMPLICIT:
                plot_implicit(funcid); break;
            case Function::FUNC_TYPE_PARAMETRIC:
                {
                    if (func.exprs.size() != 2) continue;
                    std::vector<std::array<float, 2> > curr_line;
                    double tmin = (double)func.tmin;
                    double tmax = (double)func.tmax;
                    if (tmin > tmax) std::swap(tmin, tmax);
                    double tstep = std::max((tmax - tmin) / PARAMETRIC_STEPS, 1e-12);
                    double px, py;
                    for (double t = tmin; t <= tmax; t += tstep) {
                        env.vars[t_var] = t;
                        double x = func.exprs[0](env),
                               y = func.exprs[1](env);
                        if (t > tmin && util::sqr_dist(x, y, px, py) > PARAMETRIC_DISCONN_THRESH) {
                            buf_add_screen_polyline(draw_buf, view, curr_line, func.line_color, funcid, 2.f);
                            curr_line.clear();
                        }
                        float sx = _X_TO_SX(x), sy = _Y_TO_SY(y);
                        curr_line.push_back({sx, sy});
                        px = x; py = y;
                    }
                    buf_add_screen_polyline(draw_buf, view, curr_line, func.line_color, funcid, 2.f);
                }
                break;
            case Function::FUNC_TYPE_POLAR:
                {
                    std::vector<std::array<double, 2> > curr_line;
                    std::vector<double> vals;
                    double tmin = (double)func.tmin;
                    double tmax = (double)func.tmax;
                    if (tmin > tmax) std::swap(tmin, tmax);
                    bool has_line = ((func.type & Function::FUNC_TYPE_MOD_INEQ_STRICT) == 0);
                    bool is_ineq = (func.type & Function::FUNC_TYPE_MOD_INEQ) != 0;
                    bool is_ineq_less = (func.type & Function::FUNC_TYPE_MOD_INEQ_LESS) != 0;
                    if (is_ineq) {
                        vals.reserve((tmax - tmin) / POLAR_STEP_SIZE + 1);
                    }
                    if (has_line) {
                        curr_line.reserve((tmax - tmin) / POLAR_STEP_SIZE + 1);
                    }
                    for (double t = tmin; t <= tmax; t += POLAR_STEP_SIZE) {
                        env.vars[t_var] = t;
                        double r = func.expr(env);
                        if (is_ineq) vals.push_back(r);
                        if (has_line) {
                            double x = r * cos(t), y = r * sin(t);
                            curr_line.push_back({x, y});
                        }
                    }
                    if (has_line) {
                        buf_add_polyline(draw_buf, view, curr_line, func.line_color, funcid, 2.f,
                                false, true, false);
                    }
                    if (is_ineq) {
                        const float INTERVAL = 1.5f;
                        double beg_mod = std::fmod(tmin, 2*M_PI);
                        double end_mod = std::fmod(tmax, 2*M_PI);
                        if (beg_mod < 0) beg_mod += 2 * M_PI;
                        if (end_mod < 0) end_mod += 2 * M_PI;
                        double t_start = tmin - beg_mod;
                        double t_end = tmax + (end_mod == 0.0 ? 0.0 : (2*M_PI - end_mod));
                        for (float sy = 0; sy < view.shigh; sy += INTERVAL) {
                            double y = _SY_TO_Y(sy);
                            for (float sx = 0; sx < view.swid; sx += INTERVAL) {
                                double x = _SX_TO_X(sx);
                                double theta_mod = std::atan2(y, x);
                                double r = std::sqrt(x*x + y*y);
                                if (theta_mod < 0) theta_mod += 2 * M_PI;
                                double alpha = 0.;
                                for (double t = t_start; t <= tmax + t_end; t += 2*M_PI) {
                                    double theta = t + theta_mod;
                                    if (theta < tmin || theta > tmax) continue;
                                    size_t near_idx = std::min((size_t)std::max(
                                                std::round((theta - tmin) / POLAR_STEP_SIZE), 0.),
                                                vals.size() - 1);
                                    double thresh_r = vals[near_idx];
                                    if (r < thresh_r == is_ineq_less) {
                                        alpha = 0.25 + 0.75 * alpha; // Simulate blend
                                    }
                                }
                                if (alpha > 0.) {
                                    color::color c = func.line_color;
                                    c.a = alpha;
                                    buf_add_screen_rectangle(draw_buf, view, sx, sy,
                                            INTERVAL, INTERVAL, true, c, 0.0f, funcid);
                                }
                            }
                        }
                    }
                }
                break;
            case Function::FUNC_TYPE_EXPLICIT:
                plot_explicit(funcid, false); break;
            case Function::FUNC_TYPE_EXPLICIT_Y:
                plot_explicit(funcid, true); break;

            // Geometry (other than polyline)
            case Function::FUNC_TYPE_GEOM_RECT:
                {
                    if (func.exprs.size() != 4) break;
                    DrawBufferObject obj;
                    obj.rel_func = funcid;
                    obj.c = func.line_color;
                    obj.thickness = 2.;
                    obj.type = DrawBufferObject::RECT;
                    obj.points.resize(2);
                    auto& a = obj.points[0], &b = obj.points[1];
                    a[0] = func.exprs[0](env);
                    a[1] = func.exprs[1](env);
                    b[0] = func.exprs[2](env);
                    b[1] = func.exprs[3](env);
                    if (b[0] < a[0]) std::swap(a[0], b[0]);
                    if (b[1] < a[1]) std::swap(a[1], b[1]);
                    if (func.type & Function::FUNC_TYPE_MOD_FILLED) {
                        DrawBufferObject obj2 = obj;
                        obj2.type = DrawBufferObject::FILLED_RECT;
                        obj2.c = get_ineq_color(func.line_color);
                        draw_buf.push_back(std::move(obj2));
                    }
                    if ((func.type & Function::FUNC_TYPE_MOD_NOLINE) == 0) {
                        draw_buf.push_back(std::move(obj));
                    }
                }
                break;
            case Function::FUNC_TYPE_GEOM_CIRCLE:
            case Function::FUNC_TYPE_GEOM_ELLIPSE:
                {
                    size_t is_ellipse = (ftype_nomod == Function::FUNC_TYPE_GEOM_ELLIPSE);
                    if (func.exprs.size() != 3 + is_ellipse) break;
                    DrawBufferObject obj;
                    obj.rel_func = funcid;
                    obj.c = func.line_color;
                    obj.thickness = 2.;
                    obj.type = is_ellipse ? DrawBufferObject::ELLIPSE : DrawBufferObject::CIRCLE;
                    obj.points.resize(2);
                    auto& a = obj.points[0], &right = obj.points[1];
                    a[0] = func.exprs[0](env);
                    a[1] = func.exprs[1](env);
                    right[0] = a[0] + func.exprs[2](env);
                    right[1] = a[1];
                    if (is_ellipse) right[1] += func.exprs[3](env);
                    if (func.type & Function::FUNC_TYPE_MOD_FILLED) {
                        DrawBufferObject obj2 = obj;
                        obj2.type = is_ellipse ? DrawBufferObject::FILLED_ELLIPSE :
                            DrawBufferObject::FILLED_CIRCLE;
                        obj2.c = get_ineq_color(func.line_color);
                        draw_buf.push_back(std::move(obj2));
                    }
                    if ((func.type & Function::FUNC_TYPE_MOD_NOLINE) == 0) {
                        draw_buf.push_back(std::move(obj));
                    }
                }
                break;
            case Function::FUNC_TYPE_GEOM_TEXT:
                {
                    if (func.exprs.size() != 2) break;
                    DrawBufferObject obj;
                    obj.rel_func = funcid;
                    obj.c = func.line_color;
                    obj.type = DrawBufferObject::TEXT;
                    obj.points = { { func.exprs[0](env), func.exprs[1](env) } };
                    obj.str = func.str;
                    draw_buf.push_back(std::move(obj));
                }
                break;
            case Function::FUNC_TYPE_FRACTAL_MANDELBROT:
                {
                }
                break;
        }
    }
    // PROFILE(all);
    if (loss_detail) {
        func_error = "Warning: some detail may be lost";
    } else if (prev_loss_detail) {
        func_error.clear();
    }
}